

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_bool32 drwav__on_seek_memory(void *pUserData,int offset,drwav_seek_origin origin)

{
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  drwav *pWav;
  
  if (in_RDI == 0) {
    __assert_fail("pWav != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                  ,0xcc8,"drwav_bool32 drwav__on_seek_memory(void *, int, drwav_seek_origin)");
  }
  if (in_EDX == 1) {
    if ((int)in_ESI < 1) {
      if (*(ulong *)(in_RDI + 0xf0) < (ulong)(long)(int)-in_ESI) {
        return 0;
      }
    }
    else if (*(ulong *)(in_RDI + 0xe8) < (ulong)(*(long *)(in_RDI + 0xf0) + (long)(int)in_ESI)) {
      return 0;
    }
    *(long *)(in_RDI + 0xf0) = (long)(int)in_ESI + *(long *)(in_RDI + 0xf0);
  }
  else {
    if (*(ulong *)(in_RDI + 0xe8) < (ulong)in_ESI) {
      return 0;
    }
    *(long *)(in_RDI + 0xf0) = (long)(int)in_ESI;
  }
  return 1;
}

Assistant:

static drwav_bool32 drwav__on_seek_memory(void* pUserData, int offset, drwav_seek_origin origin)
{
    drwav* pWav = (drwav*)pUserData;
    DRWAV_ASSERT(pWav != NULL);

    if (origin == drwav_seek_origin_current) {
        if (offset > 0) {
            if (pWav->memoryStream.currentReadPos + offset > pWav->memoryStream.dataSize) {
                return DRWAV_FALSE; /* Trying to seek too far forward. */
            }
        } else {
            if (pWav->memoryStream.currentReadPos < (size_t)-offset) {
                return DRWAV_FALSE; /* Trying to seek too far backwards. */
            }
        }

        /* This will never underflow thanks to the clamps above. */
        pWav->memoryStream.currentReadPos += offset;
    } else {
        if ((drwav_uint32)offset <= pWav->memoryStream.dataSize) {
            pWav->memoryStream.currentReadPos = offset;
        } else {
            return DRWAV_FALSE; /* Trying to seek too far forward. */
        }
    }
    
    return DRWAV_TRUE;
}